

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

void __thiscall Matrix::LowerTriangular(Matrix *this)

{
  int local_18;
  int local_14;
  int j;
  int i;
  Matrix *this_local;
  
  for (local_14 = 0; local_14 < this->rowNo; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < this->colNo; local_18 = local_18 + 1) {
      if (local_14 < local_18) {
        this->array[local_14][local_18] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void Matrix::LowerTriangular()
{
    for (int i = 0; i < rowNo; i++)
    {
        for (int j = 0; j < colNo; j++)
        {
            if (i < j)
            {
                array[i][j] = 0;
            }
        }
    }

}